

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::anon_unknown_2::GenerateEnumToPool
               (EnumDescriptor *en,Printer *printer)

{
  long lVar1;
  int32 value;
  long lVar2;
  long lVar3;
  string local_90;
  string local_70;
  string local_50;
  
  DescriptorFullName<google::protobuf::EnumDescriptor>(&local_70,en,true);
  io::Printer::Print<char[5],std::__cxx11::string,char[11],std::__cxx11::string>
            (printer,
             "$pool->addEnum(\'^name^\', \\Google\\Protobuf\\Internal\\^class_name^::class)\n",
             (char (*) [5])0x3de831,&local_70,(char (*) [11])0x3d12fb,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(en + 8));
  std::__cxx11::string::~string((string *)&local_70);
  Indent(printer);
  lVar3 = 8;
  for (lVar2 = 0; lVar2 < *(int *)(en + 4); lVar2 = lVar2 + 1) {
    lVar1 = *(long *)(en + 0x28);
    ConstantNamePrefix(&local_90,*(string **)(lVar1 + lVar3));
    std::operator+(&local_70,&local_90,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar1 + lVar3));
    (anonymous_namespace)::IntToString_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)(ulong)*(uint *)(lVar1 + -4 + lVar3),value);
    io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,"->value(\"^name^\", ^number^)\n",(char (*) [5])0x3de831,&local_70,
               (char (*) [7])0x3f3265,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    lVar3 = lVar3 + 0x20;
  }
  io::Printer::Print<>(printer,"->finalizeToPool();\n\n");
  Outdent(printer);
  return;
}

Assistant:

void GenerateEnumToPool(const EnumDescriptor* en, io::Printer* printer) {
  printer->Print(
      "$pool->addEnum('^name^', "
      "\\Google\\Protobuf\\Internal\\^class_name^::class)\n",
      "name", DescriptorFullName(en, true),
      "class_name", en->name());
  Indent(printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer->Print(
        "->value(\"^name^\", ^number^)\n",
        "name", ConstantNamePrefix(value->name()) + value->name(),
        "number", IntToString(value->number()));
  }
  printer->Print("->finalizeToPool();\n\n");
  Outdent(printer);
}